

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR eval_union_expr(lyxp_expr *exp,uint32_t *tok_idx,uint32_t repeat,lyxp_set *set,
                      uint32_t options)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  undefined1 local_158 [7];
  ly_bool found;
  lyxp_set set2;
  lyxp_set orig_set;
  LY_ERR local_30;
  uint32_t i;
  LY_ERR rc;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t repeat_local;
  uint32_t *tok_idx_local;
  lyxp_expr *exp_local;
  
  bVar3 = false;
  if (repeat == 0) {
    __assert_fail("repeat",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x2356,
                  "LY_ERR eval_union_expr(const struct lyxp_expr *, uint32_t *, uint32_t, struct lyxp_set *, uint32_t)"
                 );
  }
  set_init((lyxp_set *)&set2.field_0x88,set);
  set_init((lyxp_set *)local_158,set);
  set_fill_set((lyxp_set *)&set2.field_0x88,set);
  local_30 = eval_expr_select(exp,tok_idx,LYXP_EXPR_UNION,set,options);
  if (local_30 == LY_SUCCESS) {
    bVar3 = set->not_found == '\0';
    if (!bVar3) {
      set->not_found = '\0';
    }
    for (orig_set._140_4_ = 0; (uint)orig_set._140_4_ < repeat;
        orig_set._140_4_ = orig_set._140_4_ + 1) {
      if (exp->tokens[*tok_idx] != LYXP_TOKEN_OPER_UNI) {
        __assert_fail("exp->tokens[*tok_idx] == LYXP_TOKEN_OPER_UNI",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c"
                      ,0x2367,
                      "LY_ERR eval_union_expr(const struct lyxp_expr *, uint32_t *, uint32_t, struct lyxp_set *, uint32_t)"
                     );
      }
      pcVar1 = "parsed";
      if ((options & 0x20) != 0) {
        pcVar1 = "skipped";
      }
      pcVar2 = lyxp_token2str(exp->tokens[*tok_idx]);
      ly_log_dbg(2,"%-27s %s %s[%u]","eval_union_expr",pcVar1,pcVar2,(ulong)exp->tok_pos[*tok_idx]);
      *tok_idx = *tok_idx + 1;
      if ((options & 0x20) == 0) {
        set_fill_set((lyxp_set *)local_158,(lyxp_set *)&set2.field_0x88);
        local_30 = eval_expr_select(exp,tok_idx,LYXP_EXPR_UNION,(lyxp_set *)local_158,options);
        if (local_30 != LY_SUCCESS) break;
        if (set2.ctx_pos._1_1_ == '\0') {
          bVar3 = true;
        }
        if ((options & 0x1c) == 0) {
          local_30 = moveto_union(set,(lyxp_set *)local_158);
          goto joined_r0x00217ccc;
        }
        lyxp_set_scnode_merge(set,(lyxp_set *)local_158);
      }
      else {
        local_30 = eval_expr_select(exp,tok_idx,LYXP_EXPR_UNION,set,options);
joined_r0x00217ccc:
        if (local_30 != LY_SUCCESS) break;
      }
    }
  }
  lyxp_set_free_content((lyxp_set *)&set2.field_0x88);
  lyxp_set_free_content((lyxp_set *)local_158);
  if (!bVar3) {
    set->not_found = '\x01';
  }
  return local_30;
}

Assistant:

static LY_ERR
eval_union_expr(const struct lyxp_expr *exp, uint32_t *tok_idx, uint32_t repeat, struct lyxp_set *set, uint32_t options)
{
    LY_ERR rc = LY_SUCCESS;
    uint32_t i;
    struct lyxp_set orig_set, set2;
    ly_bool found = 0;

    assert(repeat);

    set_init(&orig_set, set);
    set_init(&set2, set);

    set_fill_set(&orig_set, set);

    rc = eval_expr_select(exp, tok_idx, LYXP_EXPR_UNION, set, options);
    LY_CHECK_GOTO(rc, cleanup);
    if (set->not_found) {
        set->not_found = 0;
    } else {
        found = 1;
    }

    /* ('|' PathExpr)* */
    for (i = 0; i < repeat; ++i) {
        assert(exp->tokens[*tok_idx] == LYXP_TOKEN_OPER_UNI);
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);

        if (options & LYXP_SKIP_EXPR) {
            rc = eval_expr_select(exp, tok_idx, LYXP_EXPR_UNION, set, options);
            LY_CHECK_GOTO(rc, cleanup);
            continue;
        }

        set_fill_set(&set2, &orig_set);
        rc = eval_expr_select(exp, tok_idx, LYXP_EXPR_UNION, &set2, options);
        LY_CHECK_GOTO(rc, cleanup);
        if (!set2.not_found) {
            found = 1;
        }

        /* eval */
        if (options & LYXP_SCNODE_ALL) {
            lyxp_set_scnode_merge(set, &set2);
        } else {
            rc = moveto_union(set, &set2);
            LY_CHECK_GOTO(rc, cleanup);
        }
    }

cleanup:
    lyxp_set_free_content(&orig_set);
    lyxp_set_free_content(&set2);
    if (!found) {
        set->not_found = 1;
    }
    return rc;
}